

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O2

bool Catch::replaceInPlace(string *str,string *replaceThis,string *withThis)

{
  ulong uVar1;
  bool bVar2;
  bool bVar3;
  ulong uStack_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  bVar2 = false;
  uVar1 = std::__cxx11::string::find((string *)str,(ulong)replaceThis);
  while (uVar1 != 0xffffffffffffffff) {
    std::__cxx11::string::substr((ulong)&local_b0,(ulong)str);
    std::operator+(&local_90,&local_b0,withThis);
    std::__cxx11::string::substr((ulong)&local_70,(ulong)str);
    std::operator+(&local_50,&local_90,&local_70);
    std::__cxx11::string::operator=((string *)str,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
    bVar2 = true;
    uStack_c0 = 0xffffffffffffffff;
    bVar3 = uVar1 < str->_M_string_length - withThis->_M_string_length;
    uVar1 = uStack_c0;
    if (bVar3) {
      uVar1 = std::__cxx11::string::find((string *)str,(ulong)replaceThis);
    }
  }
  return bVar2;
}

Assistant:

bool replaceInPlace( std::string& str, std::string const& replaceThis, std::string const& withThis ) {
        bool replaced = false;
        std::size_t i = str.find( replaceThis );
        while( i != std::string::npos ) {
            replaced = true;
            str = str.substr( 0, i ) + withThis + str.substr( i+replaceThis.size() );
            if( i < str.size()-withThis.size() )
                i = str.find( replaceThis, i+withThis.size() );
            else
                i = std::string::npos;
        }
        return replaced;
    }